

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

int nn_sock_term(nn_sock *self)

{
  nn_ctx *self_00;
  nn_optset *pnVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  do {
    iVar2 = nn_sem_wait(&self->termsem);
    if (iVar2 == 0) goto LAB_0011fa0f;
  } while (iVar2 == -4);
  nn_sock_term_cold_2();
LAB_0011fa0f:
  do {
    iVar2 = nn_sem_wait(&self->relesem);
    if (iVar2 == 0) goto LAB_0011fa2e;
  } while (iVar2 == -4);
  nn_sock_term_cold_1();
LAB_0011fa2e:
  self_00 = &self->ctx;
  nn_ctx_enter(self_00);
  nn_ctx_leave(self_00);
  uVar3 = self->socktype->flags;
  if ((uVar3 & 1) == 0) {
    nn_efd_term(&self->rcvfd);
    uVar3 = self->socktype->flags;
  }
  if ((uVar3 & 2) == 0) {
    nn_efd_term(&self->sndfd);
  }
  nn_fsm_stopped_noevent(&self->fsm);
  nn_fsm_term(&self->fsm);
  nn_sem_term(&self->termsem);
  nn_sem_term(&self->relesem);
  nn_list_term(&self->sdeps);
  nn_list_term(&self->eps);
  nn_ctx_term(self_00);
  lVar4 = 0;
  do {
    pnVar1 = self->optsets[lVar4];
    if (pnVar1 != (nn_optset *)0x0) {
      (*pnVar1->vfptr->destroy)(pnVar1);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return 0;
}

Assistant:

int nn_sock_term (struct nn_sock *self)
{
    int rc;
    int i;

    /*  NOTE: nn_sock_stop must have already been called. */

    /*  Some endpoints may still be alive.  Here we are going to wait
        till they are all closed.  This loop is not interruptible, because
        making it so would leave a partially cleaned up socket, and we don't
        have a way to defer resource deallocation. */
    for (;;) {
        rc = nn_sem_wait (&self->termsem);
        if (nn_slow (rc == -EINTR))
            continue;
        errnum_assert (rc == 0, -rc);
        break;
    }

    /*  Also, wait for all holds on the socket to be released.  */
    for (;;) {
        rc = nn_sem_wait (&self->relesem);
        if (nn_slow (rc == -EINTR))
            continue;
        errnum_assert (rc == 0, -rc);
        break;
    }

    /*  Threads that posted the semaphore(s) can still have the ctx locked
        for a short while. By simply entering the context and exiting it
        immediately we can be sure that any such threads have already
        exited the context. */
    nn_ctx_enter (&self->ctx);
    nn_ctx_leave (&self->ctx);

    /*  At this point, we can be reasonably certain that no other thread
        has any references to the socket. */

    /*  Close the event FDs entirely. */
    if (!(self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
        nn_efd_term (&self->rcvfd);
    }
    if (!(self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
        nn_efd_term (&self->sndfd);
    }

    nn_fsm_stopped_noevent (&self->fsm);
    nn_fsm_term (&self->fsm);
    nn_sem_term (&self->termsem);
    nn_sem_term (&self->relesem);
    nn_list_term (&self->sdeps);
    nn_list_term (&self->eps);
    nn_ctx_term (&self->ctx);

    /*  Destroy any optsets associated with the socket. */
    for (i = 0; i != NN_MAX_TRANSPORT; ++i)
        if (self->optsets [i])
            self->optsets [i]->vfptr->destroy (self->optsets [i]);

    return 0;
}